

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  ulong uVar1;
  pointer *ppEVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  EditType EVar6;
  pointer pdVar7;
  iterator __position;
  pointer pEVar8;
  pointer pEVar9;
  void *pvVar10;
  EditType *pEVar11;
  long lVar12;
  pointer pdVar13;
  ulong uVar14;
  pointer pEVar15;
  undefined4 uVar16;
  pointer puVar17;
  ulong uVar18;
  pointer puVar19;
  pointer puVar20;
  pointer puVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  EditType move;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  allocator_type local_72;
  allocator_type local_71;
  vector<double,_std::allocator<double>_> local_70;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  local_58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_40;
  
  puVar21 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_70,
             ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_58);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_40,((long)puVar17 - (long)puVar21 >> 3) + 1,&local_70,&local_72);
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  puVar21 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar17 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector(&local_58,
           ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_72);
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
            *)&local_70,((long)puVar17 - (long)puVar21 >> 3) + 1,&local_58,&local_71);
  pvVar10 = (void *)CONCAT44(local_58.
                             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (EditType)
                             local_58.
                             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,(long)local_58.
                                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar10
                   );
  }
  if (local_40.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_40.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar12 = 0;
    uVar18 = 0;
    do {
      auVar23._8_4_ = (int)(uVar18 >> 0x20);
      auVar23._0_8_ = uVar18;
      auVar23._12_4_ = 0x45300000;
      **(double **)
        ((long)&((local_40.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_start + lVar12) =
           (auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0);
      **(undefined4 **)
        ((long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + lVar12) = 2;
      uVar18 = uVar18 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar18 < (ulong)(((long)local_40.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_40.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  pdVar13 = ((local_40.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if (8 < (ulong)((long)((local_40.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar13)) {
    uVar18 = 1;
    do {
      auVar24._8_4_ = (int)(uVar18 >> 0x20);
      auVar24._0_8_ = uVar18;
      auVar24._12_4_ = 0x45300000;
      pdVar13[uVar18] =
           (auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0);
      *(undefined4 *)
       ((long)*local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar18 * 4) = 1;
      uVar18 = uVar18 + 1;
      pdVar13 = ((local_40.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_start;
    } while (uVar18 < (ulong)((long)((local_40.
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar13 >> 3));
  }
  puVar19 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar20 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  puVar17 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar21 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar20 == puVar19) {
    uVar18 = 0;
  }
  else {
    uVar14 = 0;
    do {
      uVar1 = uVar14 + 1;
      bVar22 = puVar21 != puVar17;
      puVar21 = puVar17;
      if (bVar22) {
        uVar18 = 0;
        do {
          if ((left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar14] == puVar17[uVar18]) {
            local_40.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar1].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar18 + 1] =
                 local_40.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar18];
            uVar16 = 0;
          }
          else {
            pdVar13 = local_40.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar1].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar3 = pdVar13[uVar18];
            pdVar7 = local_40.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar4 = pdVar7[uVar18];
            dVar5 = pdVar7[uVar18 + 1];
            if ((dVar5 <= dVar3) || (dVar4 <= dVar3)) {
              if ((dVar3 <= dVar5) || (dVar4 <= dVar5)) {
                pdVar13[uVar18 + 1] = dVar4 + 1.00001;
                uVar16 = 3;
              }
              else {
                pdVar13[uVar18 + 1] = dVar5 + 1.0;
                uVar16 = 2;
              }
            }
            else {
              pdVar13[uVar18 + 1] = dVar3 + 1.0;
              uVar16 = 1;
            }
          }
          *(undefined4 *)
           ((long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar1 * 3] + 4 + uVar18 * 4) = uVar16;
          uVar18 = uVar18 + 1;
          puVar17 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar21 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        } while (uVar18 < (ulong)((long)puVar21 - (long)puVar17 >> 3));
        puVar19 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        puVar20 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar18 = (long)puVar20 - (long)puVar19 >> 3;
      uVar14 = uVar1;
    } while (uVar1 < uVar18);
  }
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((uVar18 != 0) || (puVar21 != puVar17)) {
    lVar12 = (long)puVar21 - (long)puVar17 >> 3;
    do {
      local_58.
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(EditType *)
            ((long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18 * 3] + lVar12 * 4);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
        ::_M_realloc_insert<testing::internal::edit_distance::EditType_const&>
                  ((vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
                    *)__return_storage_ptr__,__position,(EditType *)&local_58);
      }
      else {
        *__position._M_current =
             (EditType)
             local_58.
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ppEVar2 = &(__return_storage_ptr__->
                   super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar2 = *ppEVar2 + 1;
      }
      uVar18 = uVar18 - ((EditType)
                         local_58.
                         super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                         ._M_impl.super__Vector_impl_data._M_start != kAdd);
      lVar12 = lVar12 - (ulong)((EditType)
                                local_58.
                                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                ._M_impl.super__Vector_impl_data._M_start != kRemove);
    } while (uVar18 != 0 || lVar12 != 0);
    pEVar8 = (__return_storage_ptr__->
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pEVar9 = (__return_storage_ptr__->
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pEVar15 = pEVar9 + -1;
    if (pEVar8 < pEVar15 && pEVar8 != pEVar9) {
      do {
        pEVar11 = pEVar8 + 1;
        EVar6 = *pEVar8;
        *pEVar8 = *pEVar15;
        *pEVar15 = EVar6;
        pEVar15 = pEVar15 + -1;
        pEVar8 = pEVar11;
      } while (pEVar11 < pEVar15);
    }
  }
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             *)&local_70);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}